

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void INT_CM_fd_add_select
               (CManager_conflict cm,int fd,select_list_func handler_func,void *param1,void *param2)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  undefined8 in_RCX;
  long in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined8 in_R8;
  CManager unaff_retaddr;
  timespec ts;
  CManager_conflict in_stack_000000e8;
  CMControlList in_stack_000000f0;
  timespec local_38;
  undefined8 local_28;
  undefined8 local_20;
  long local_18;
  undefined4 local_c;
  
  if (in_RDX != 0) {
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_c = in_ESI;
    if (*(int *)(*(long *)(in_RDI + 0x20) + 0x50) == 0) {
      CM_init_select(in_stack_000000f0,in_stack_000000e8);
    }
    (**(code **)(*(long *)(in_RDI + 0x20) + 0x60))
              (&CMstatic_trans_svcs,*(long *)(in_RDI + 0x20) + 0x58,local_c,local_18,local_20,
               local_28);
    return;
  }
  if (*(long *)(in_RDI + 0x120) == 0) {
    iVar1 = CMtrace_init(unaff_retaddr,(CMTraceType)((ulong)in_RDI >> 0x20));
    if (iVar1 == 0) goto LAB_0011450d;
  }
  else if (CMtrace_val[0xb] == 0) goto LAB_0011450d;
  if (CMtrace_PID != 0) {
    __stream = *(FILE **)(in_RDI + 0x120);
    _Var2 = getpid();
    pVar3 = pthread_self();
    fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_38);
    fprintf(*(FILE **)(in_RDI + 0x120),"%lld.%.9ld - ",local_38.tv_sec,local_38.tv_nsec);
  }
  fprintf(*(FILE **)(in_RDI + 0x120),
          "INT_CM_fd_add_select called with bogus notification function; ignored\n");
LAB_0011450d:
  fflush(*(FILE **)(in_RDI + 0x120));
  return;
}

Assistant:

extern void
 INT_CM_fd_add_select(CManager cm, SOCKET fd, select_list_func handler_func,
		      void *param1, void *param2)
 {
     if (!handler_func) {
	 CMtrace_out(cm, EVWarning, "INT_CM_fd_add_select called with bogus notification function; ignored\n");
	 return;
     }
     if (!cm->control_list->select_initialized) {
	 CM_init_select(cm->control_list, cm);
     }
     cm->control_list->add_select(&CMstatic_trans_svcs,
				  &cm->control_list->select_data, fd,
				  handler_func, param1, param2);
 }